

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

Node * __thiscall asmjit::ConstPool::Tree::get(Tree *this,void *data)

{
  size_t __n;
  Node *pNVar1;
  uint uVar2;
  
  __n = this->_dataSize;
  while( true ) {
    pNVar1 = this->_root;
    if (pNVar1 == (Node *)0x0) {
      return (Node *)0x0;
    }
    uVar2 = memcmp(pNVar1 + 1,data,__n);
    if (uVar2 == 0) break;
    this = (Tree *)(pNVar1->_link + (uVar2 >> 0x1f));
  }
  return pNVar1;
}

Assistant:

ConstPool::Node* ConstPool::Tree::get(const void* data) noexcept {
  ConstPool::Node* node = _root;
  size_t dataSize = _dataSize;

  while (node) {
    int c = ::memcmp(node->getData(), data, dataSize);
    if (c == 0)
      return node;
    node = node->_link[c < 0];
  }

  return nullptr;
}